

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O2

bool crnlib::prefix_coding::limit_max_code_size(uint num_syms,uint8 *pCodesizes,uint max_code_size)

{
  byte bVar1;
  bool bVar2;
  uint i;
  uint uVar3;
  long lVar4;
  uint8 *__s;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint num_codes [35];
  uint next_sorted_ofs [35];
  uint8 new_codesizes [8192];
  
  if (0xffffffdd < max_code_size - 0x23 && 0xffffdfff < num_syms - 0x2001) {
    memset(num_codes,0,0x8c);
    bVar2 = false;
    for (uVar9 = 0; num_syms != uVar9; uVar9 = uVar9 + 1) {
      bVar1 = pCodesizes[uVar9];
      if (bVar1 != 0) {
        num_codes[(uint)bVar1] = num_codes[(uint)bVar1] + 1;
        bVar2 = (bool)(bVar2 | max_code_size < bVar1);
      }
    }
    if (!bVar2) {
      return true;
    }
    uVar6 = 0;
    for (lVar4 = 1; lVar4 != 0x23; lVar4 = lVar4 + 1) {
      next_sorted_ofs[lVar4] = uVar6;
      uVar6 = uVar6 + num_codes[lVar4];
    }
    if (uVar6 - 0x2001 < 0xffffe001) {
      return true;
    }
    uVar3 = 1 << ((byte)max_code_size & 0x1f);
    if (uVar6 <= uVar3) {
      uVar5 = (ulong)max_code_size;
      uVar9 = uVar5;
      while (uVar9 = uVar9 + 1, uVar9 != 0x23) {
        num_codes[uVar5] = num_codes[uVar5] + num_codes[uVar9];
      }
      puVar7 = num_codes + uVar5;
      uVar6 = 0;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        uVar6 = uVar6 + (*puVar7 << ((byte)uVar9 & 0x1f));
        puVar7 = puVar7 + -1;
      }
      if (uVar6 != uVar3) {
        do {
          num_codes[uVar5] = num_codes[uVar5] - 1;
          uVar9 = uVar5 + 1;
          do {
            uVar8 = uVar9;
            if (uVar8 == 2) {
              return false;
            }
            uVar9 = uVar8 - 1;
          } while (num_codes[uVar8 - 2] == 0);
          num_codes[uVar8 - 2] = num_codes[uVar8 - 2] - 1;
          num_codes[uVar8 - 1 & 0xffffffff] = num_codes[uVar8 - 1 & 0xffffffff] + 2;
          uVar6 = uVar6 - 1;
        } while (uVar6 != uVar3);
        __s = new_codesizes;
        for (uVar9 = 1; max_code_size + 1 != uVar9; uVar9 = uVar9 + 1) {
          uVar5 = (ulong)num_codes[uVar9];
          if (uVar5 != 0) {
            memset(__s,(int)uVar9,uVar5);
            __s = __s + uVar5;
          }
        }
        for (uVar9 = 0; num_syms != uVar9; uVar9 = uVar9 + 1) {
          uVar5 = (ulong)pCodesizes[uVar9];
          if (uVar5 != 0) {
            uVar6 = next_sorted_ofs[uVar5];
            next_sorted_ofs[uVar5] = uVar6 + 1;
            pCodesizes[uVar9] = new_codesizes[uVar6];
          }
        }
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool limit_max_code_size(uint num_syms, uint8* pCodesizes, uint max_code_size)
        {
            const uint cMaxEverCodeSize = 34;

            if ((!num_syms) || (num_syms > cMaxSupportedSyms) || (max_code_size < 1) || (max_code_size > cMaxEverCodeSize))
            {
                return false;
            }

            uint num_codes[cMaxEverCodeSize + 1];
            utils::zero_object(num_codes);

            bool should_limit = false;

            for (uint i = 0; i < num_syms; i++)
            {
                uint c = pCodesizes[i];
                if (c)
                {
                    CRNLIB_ASSERT(c <= cMaxEverCodeSize);

                    num_codes[c]++;
                    if (c > max_code_size)
                    {
                        should_limit = true;
                    }
                }
            }

            if (!should_limit)
            {
                return true;
            }

            uint ofs = 0;
            uint next_sorted_ofs[cMaxEverCodeSize + 1];
            for (uint i = 1; i <= cMaxEverCodeSize; i++)
            {
                next_sorted_ofs[i] = ofs;
                ofs += num_codes[i];
            }

            if ((ofs < 2) || (ofs > cMaxSupportedSyms))
            {
                return true;
            }

            if (ofs > (1U << max_code_size))
            {
                return false;
            }

            for (uint i = max_code_size + 1; i <= cMaxEverCodeSize; i++)
            {
                num_codes[max_code_size] += num_codes[i];
            }

            // Technique of adjusting tree to enforce maximum code size from LHArc.

            uint total = 0;
            for (uint i = max_code_size; i; --i)
            {
                total += (num_codes[i] << (max_code_size - i));
            }

            if (total == (1U << max_code_size))
            {
                return true;
            }

            do
            {
                num_codes[max_code_size]--;

                uint i;
                for (i = max_code_size - 1; i; --i)
                {
                    if (!num_codes[i])
                    {
                        continue;
                    }
                    num_codes[i]--;
                    num_codes[i + 1] += 2;
                    break;
                }
                if (!i)
                {
                    return false;
                }

                total--;
            }
            while (total != (1U << max_code_size));

            uint8 new_codesizes[cMaxSupportedSyms];
            uint8* p = new_codesizes;
            for (uint i = 1; i <= max_code_size; i++)
            {
                uint n = num_codes[i];
                if (n)
                {
                    memset(p, i, n);
                    p += n;
                }
            }

            for (uint i = 0; i < num_syms; i++)
            {
                const uint c = pCodesizes[i];
                if (c)
                {
                    uint ofs = next_sorted_ofs[c];
                    next_sorted_ofs[c] = ofs + 1;

                    pCodesizes[i] = static_cast<uint8>(new_codesizes[ofs]);
                }
            }

            return true;
        }